

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_gen.cpp
# Opt level: O3

int __thiscall IntegerRandomGenerator::generate(IntegerRandomGenerator *this)

{
  double dVar1;
  pointer pdVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  dVar6 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&mRng);
  pdVar2 = (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if ((int)(uVar4 >> 3) != 0) {
    uVar4 = (long)uVar4 >> 3;
    dVar6 = dVar6 + 0.0;
    uVar5 = 0;
    do {
      if (uVar4 == uVar5) {
LAB_00107bbb:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      dVar1 = pdVar2[uVar5];
      if (dVar6 < dVar1) {
        piVar3 = (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = uVar5;
        if (uVar5 < (ulong)((long)(this->mValues).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
          return piVar3[uVar5];
        }
        goto LAB_00107bbb;
      }
      dVar6 = dVar6 - dVar1;
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0xffffffff) != uVar5);
  }
  return -1;
}

Assistant:

int IntegerRandomGenerator::generate()
{
    std::uniform_real_distribution<double> unif(0,1);
    double random = unif(mRng);

    uint32_t distSize = static_cast<uint32_t>(mDist.size());
    for(uint32_t i = 0; i < distSize; i++)
    {
        if(random < mDist.at(i))
        {
            return mValues.at(i);
        }
        else
        {
            random -= mDist.at(i);
        }
    }

    return -1;
}